

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groupnorm.cpp
# Opt level: O2

int __thiscall ncnn::GroupNorm::forward_inplace(GroupNorm *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  int iVar7;
  long lVar8;
  void *pvVar9;
  ulong uVar10;
  void *pvVar11;
  void *pvVar12;
  ulong uVar13;
  int i_4;
  ulong uVar14;
  int i_5;
  long lVar15;
  void *pvVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  int i;
  ulong uVar21;
  ulong uVar22;
  int i_2;
  uint uVar23;
  long lVar24;
  int i_3;
  long lVar25;
  int q;
  ulong uVar26;
  bool bVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  
  iVar1 = bottom_top_blob->dims;
  uVar2 = this->group;
  uVar10 = (long)this->channels / (long)(int)uVar2;
  iVar7 = (int)uVar10;
  lVar8 = (long)iVar7;
  if (iVar1 == 2) {
    uVar23 = bottom_top_blob->w;
    pvVar9 = bottom_top_blob->data;
    pvVar11 = (this->gamma_data).data;
    sVar4 = (this->gamma_data).elemsize;
    pvVar16 = (this->beta_data).data;
    sVar5 = (this->beta_data).elemsize;
    uVar21 = 0;
    uVar19 = 0;
    if (0 < (int)uVar23) {
      uVar19 = (ulong)uVar23;
    }
    uVar22 = 0;
    if (0 < iVar7) {
      uVar22 = uVar10 & 0xffffffff;
    }
    uVar26 = 0;
    if (0 < (int)uVar2) {
      uVar26 = (ulong)uVar2;
    }
    lVar18 = (long)(int)uVar23 * bottom_top_blob->elemsize;
    fVar28 = 1.0 / (float)(int)(uVar23 * iVar7);
    for (; uVar21 != uVar26; uVar21 = uVar21 + 1) {
      fVar29 = 0.0;
      pvVar12 = pvVar9;
      for (uVar17 = 0; uVar17 != uVar22; uVar17 = uVar17 + 1) {
        for (uVar13 = 0; uVar19 != uVar13; uVar13 = uVar13 + 1) {
          fVar29 = fVar29 + *(float *)((long)pvVar12 + uVar13 * 4);
        }
        pvVar12 = (void *)((long)pvVar12 + lVar18);
      }
      fVar29 = fVar29 * fVar28;
      fVar30 = 0.0;
      pvVar12 = pvVar9;
      for (uVar17 = 0; uVar17 != uVar22; uVar17 = uVar17 + 1) {
        for (uVar13 = 0; uVar19 != uVar13; uVar13 = uVar13 + 1) {
          fVar31 = *(float *)((long)pvVar12 + uVar13 * 4) - fVar29;
          fVar30 = fVar30 + fVar31 * fVar31;
        }
        pvVar12 = (void *)((long)pvVar12 + lVar18);
      }
      fVar30 = fVar30 * fVar28;
      iVar3 = this->affine;
      pvVar12 = pvVar9;
      for (uVar17 = 0; uVar17 != uVar22; uVar17 = uVar17 + 1) {
        if (iVar3 == 0) {
          fVar31 = 1.0 / SQRT(this->eps + fVar30);
          fVar32 = fVar31 * -fVar29;
        }
        else {
          fVar31 = *(float *)((long)pvVar11 + uVar17 * 4 + sVar4 * uVar21 * lVar8) /
                   SQRT(this->eps + fVar30);
          fVar32 = *(float *)((long)pvVar16 + uVar17 * 4 + uVar21 * lVar8 * sVar5) - fVar31 * fVar29
          ;
        }
        for (uVar13 = 0; uVar19 != uVar13; uVar13 = uVar13 + 1) {
          *(float *)((long)pvVar12 + uVar13 * 4) =
               *(float *)((long)pvVar12 + uVar13 * 4) * fVar31 + fVar32;
        }
        pvVar12 = (void *)((long)pvVar12 + lVar18);
      }
      pvVar9 = (void *)((long)pvVar9 + lVar18 * lVar8);
    }
  }
  else if (iVar1 == 1) {
    pvVar9 = bottom_top_blob->data;
    pvVar11 = (this->gamma_data).data;
    pvVar16 = (this->beta_data).data;
    uVar19 = 0;
    uVar21 = 0;
    if (0 < iVar7) {
      uVar21 = uVar10 & 0xffffffff;
    }
    uVar22 = 0;
    if (0 < (int)uVar2) {
      uVar22 = (ulong)uVar2;
    }
    sVar4 = bottom_top_blob->elemsize;
    sVar5 = (this->beta_data).elemsize;
    sVar6 = (this->gamma_data).elemsize;
    for (; uVar19 != uVar22; uVar19 = uVar19 + 1) {
      fVar28 = 0.0;
      for (uVar26 = 0; uVar21 != uVar26; uVar26 = uVar26 + 1) {
        fVar28 = fVar28 + *(float *)((long)pvVar9 + uVar26 * 4);
      }
      fVar28 = fVar28 * (1.0 / (float)iVar7);
      fVar29 = 0.0;
      for (uVar26 = 0; uVar21 != uVar26; uVar26 = uVar26 + 1) {
        fVar30 = *(float *)((long)pvVar9 + uVar26 * 4) - fVar28;
        fVar29 = fVar29 + fVar30 * fVar30;
      }
      fVar29 = fVar29 * (1.0 / (float)iVar7);
      iVar3 = this->affine;
      for (uVar26 = 0; uVar21 != uVar26; uVar26 = uVar26 + 1) {
        if (iVar3 == 0) {
          fVar30 = 1.0 / SQRT(this->eps + fVar29);
          fVar31 = fVar30 * -fVar28;
        }
        else {
          fVar30 = *(float *)((long)pvVar11 + uVar26 * 4) / SQRT(this->eps + fVar29);
          fVar31 = *(float *)((long)pvVar16 + uVar26 * 4) - fVar30 * fVar28;
        }
        *(float *)((long)pvVar9 + uVar26 * 4) =
             fVar30 * *(float *)((long)pvVar9 + uVar26 * 4) + fVar31;
      }
      pvVar9 = (void *)((long)pvVar9 + sVar4 * lVar8);
      pvVar16 = (void *)((long)pvVar16 + sVar5 * lVar8);
      pvVar11 = (void *)((long)pvVar11 + sVar6 * lVar8);
    }
  }
  if (iVar1 - 3U < 2) {
    uVar23 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    pvVar9 = bottom_top_blob->data;
    uVar19 = bottom_top_blob->elemsize;
    sVar4 = bottom_top_blob->cstep;
    uVar26 = (long)bottom_top_blob->d * uVar19 * (long)bottom_top_blob->h * (long)bottom_top_blob->w
             + 0xf & 0xfffffffffffffff0;
    pvVar11 = (this->gamma_data).data;
    sVar5 = (this->gamma_data).elemsize;
    uVar22 = 0;
    uVar21 = (ulong)uVar23;
    if ((int)uVar23 < 1) {
      uVar21 = uVar22;
    }
    pvVar16 = (this->beta_data).data;
    uVar10 = uVar10 & 0xffffffff;
    if (iVar7 < 1) {
      uVar10 = uVar22;
    }
    sVar6 = (this->beta_data).elemsize;
    uVar17 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar17 = uVar22;
    }
    fVar28 = 1.0 / (float)(int)(uVar23 * iVar7);
    for (; uVar22 != uVar17; uVar22 = uVar22 + 1) {
      lVar24 = uVar22 * lVar8;
      lVar18 = sVar4 * uVar19 * lVar24;
      lVar20 = uVar26 - uVar26 % uVar19;
      fVar29 = 0.0;
      for (uVar13 = 0; uVar13 != uVar10; uVar13 = uVar13 + 1) {
        lVar25 = 0;
        uVar14 = uVar21;
        while (bVar27 = uVar14 != 0, uVar14 = uVar14 - 1, bVar27) {
          fVar29 = fVar29 + *(float *)((long)pvVar9 + lVar25 * 4 + lVar20 * uVar13 + lVar18);
          lVar25 = lVar25 + 1;
        }
      }
      fVar29 = fVar29 * fVar28;
      fVar30 = 0.0;
      for (uVar13 = 0; uVar13 != uVar10; uVar13 = uVar13 + 1) {
        lVar25 = 0;
        uVar14 = uVar21;
        while (bVar27 = uVar14 != 0, uVar14 = uVar14 - 1, bVar27) {
          fVar31 = *(float *)((long)pvVar9 + lVar25 * 4 + lVar20 * uVar13 + lVar18) - fVar29;
          fVar30 = fVar30 + fVar31 * fVar31;
          lVar25 = lVar25 + 1;
        }
      }
      fVar30 = fVar30 * fVar28;
      iVar1 = this->affine;
      for (uVar13 = 0; uVar13 != uVar10; uVar13 = uVar13 + 1) {
        if (iVar1 == 0) {
          fVar31 = 1.0 / SQRT(this->eps + fVar30);
          fVar32 = fVar31 * -fVar29;
        }
        else {
          fVar31 = *(float *)((long)pvVar11 + uVar13 * 4 + sVar5 * lVar24) /
                   SQRT(this->eps + fVar30);
          fVar32 = *(float *)((long)pvVar16 + uVar13 * 4 + lVar24 * sVar6) - fVar31 * fVar29;
        }
        lVar25 = lVar20 * uVar13 + lVar18;
        lVar15 = 0;
        uVar14 = uVar21;
        while (bVar27 = uVar14 != 0, uVar14 = uVar14 - 1, bVar27) {
          *(float *)((long)pvVar9 + lVar15 * 4 + lVar25) =
               *(float *)((long)pvVar9 + lVar15 * 4 + lVar25) * fVar31 + fVar32;
          lVar15 = lVar15 + 1;
        }
      }
    }
  }
  return 0;
}

Assistant:

int GroupNorm::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    const int dims = bottom_top_blob.dims;
    const int channels_per_group = channels / group;

    if (dims == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                sum += bottom_top_blob_g[q];
            }
            float mean = sum / channels_per_group;

            float sqsum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                float tmp = bottom_top_blob_g[q] - mean;
                sqsum += tmp * tmp;
            }
            float var = sqsum / channels_per_group;

            for (int q = 0; q < channels_per_group; q++)
            {
                float a;
                float b;
                if (affine)
                {
                    float gamma = gamma_data_g[q];
                    float beta = beta_data_g[q];

                    a = gamma / sqrtf(var + eps);
                    b = -mean * a + beta;
                }
                else
                {
                    a = 1.f / (sqrtf(var + eps));
                    b = -mean * a;
                }

                bottom_top_blob_g[q] = bottom_top_blob_g[q] * a + b;
            }
        }
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.row_range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.row(q);
                for (int i = 0; i < w; i++)
                {
                    sum += ptr[i];
                }
            }
            float mean = sum / (channels_per_group * w);

            float sqsum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.row(q);
                for (int i = 0; i < w; i++)
                {
                    float tmp = ptr[i] - mean;
                    sqsum += tmp * tmp;
                }
            }
            float var = sqsum / (channels_per_group * w);

            for (int q = 0; q < channels_per_group; q++)
            {
                float a;
                float b;
                if (affine)
                {
                    float gamma = gamma_data_g[q];
                    float beta = beta_data_g[q];

                    a = gamma / sqrtf(var + eps);
                    b = -mean * a + beta;
                }
                else
                {
                    a = 1.f / (sqrtf(var + eps));
                    b = -mean * a;
                }

                float* ptr = bottom_top_blob_g.row(q);
                for (int i = 0; i < w; i++)
                {
                    ptr[i] = ptr[i] * a + b;
                }
            }
        }
    }

    if (dims == 3 || dims == 4)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int d = bottom_top_blob.d;
        int size = w * h * d;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.channel_range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.channel(q);
                for (int i = 0; i < size; i++)
                {
                    sum += ptr[i];
                }
            }
            float mean = sum / (channels_per_group * size);

            float sqsum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.channel(q);
                for (int i = 0; i < size; i++)
                {
                    float tmp = ptr[i] - mean;
                    sqsum += tmp * tmp;
                }
            }
            float var = sqsum / (channels_per_group * size);

            for (int q = 0; q < channels_per_group; q++)
            {
                float a;
                float b;
                if (affine)
                {
                    float gamma = gamma_data_g[q];
                    float beta = beta_data_g[q];

                    a = gamma / sqrtf(var + eps);
                    b = -mean * a + beta;
                }
                else
                {
                    a = 1.f / (sqrtf(var + eps));
                    b = -mean * a;
                }

                float* ptr = bottom_top_blob_g.channel(q);
                for (int i = 0; i < size; i++)
                {
                    ptr[i] = ptr[i] * a + b;
                }
            }
        }
    }

    return 0;
}